

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# PauliZ.hpp
# Opt level: O1

int __thiscall qclab::qgates::PauliZ<float>::toQASM(PauliZ<float> *this,ostream *stream,int offset)

{
  int in_ECX;
  __string_type local_30;
  
  qasm1_abi_cxx11_(&local_30,(qclab *)0x12818d,
                   (char *)(ulong)(uint)(offset + (this->super_QGate1<float>).qubit_),in_ECX);
  std::__ostream_insert<char,std::char_traits<char>>
            (stream,local_30._M_dataplus._M_p,local_30._M_string_length);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_30._M_dataplus._M_p != &local_30.field_2) {
    operator_delete(local_30._M_dataplus._M_p,local_30.field_2._M_allocated_capacity + 1);
  }
  return 0;
}

Assistant:

int toQASM( std::ostream& stream ,
                    const int offset = 0 ) const override {
          stream << qasmZ( this->qubit_ + offset ) ;
          return 0 ;
        }